

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O2

void Ivy_ObjCollectFanouts(Ivy_Man_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vArray)

{
  void **__ptr;
  Ivy_Obj_t *pFanout;
  int iVar1;
  uint uVar2;
  
  if (p->fFanout == 0) {
    __assert_fail("p->fFanout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                  ,0x109,"void Ivy_ObjCollectFanouts(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
  }
  if (((ulong)pObj & 1) == 0) {
    vArray->nSize = 0;
    for (pFanout = pObj->pFanout; pFanout != (Ivy_Obj_t *)0x0;
        pFanout = Ivy_ObjNextFanout(pObj,pFanout)) {
      iVar1 = vArray->nSize;
      if (iVar1 == vArray->nCap) {
        uVar2 = iVar1 * 2;
        if (iVar1 < 0x10) {
          uVar2 = 0x10;
        }
        __ptr = vArray->pArray;
        if (iVar1 < (int)uVar2) {
          if (__ptr == (void **)0x0) {
            __ptr = (void **)malloc((ulong)uVar2 << 3);
          }
          else {
            __ptr = (void **)realloc(__ptr,(ulong)uVar2 << 3);
            iVar1 = vArray->nSize;
          }
          vArray->pArray = __ptr;
          vArray->nCap = uVar2;
        }
      }
      else {
        __ptr = vArray->pArray;
      }
      vArray->nSize = iVar1 + 1;
      __ptr[iVar1] = pFanout;
    }
    return;
  }
  __assert_fail("!Ivy_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                ,0x10a,"void Ivy_ObjCollectFanouts(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Ivy_ObjCollectFanouts( Ivy_Man_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vArray )
{
    Ivy_Obj_t * pFanout;
    assert( p->fFanout );
    assert( !Ivy_IsComplement(pObj) );
    Vec_PtrClear( vArray );
    Ivy_ObjForEachFanoutInt( pObj, pFanout )
        Vec_PtrPush( vArray, pFanout );
}